

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O0

void listelem_stats(listelem_alloc_t *list)

{
  long local_30;
  size_t n;
  char **cpp;
  gnode_t *gn2;
  gnode_t *gn;
  listelem_alloc_t *list_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x119,"Linklist stats:\n");
  local_30 = 0;
  for (n = (size_t)list->freelist; n != 0; n = *(size_t *)n) {
    local_30 = local_30 + 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x121,"elemsize %lu, #alloc %lu, #freed %lu, #freelist %lu\n",list->elemsize,
          list->n_alloc,list->n_freed,local_30);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
          ,0x122,"Allocated blocks:\n");
  cpp = (char **)list->blocksize;
  for (gn2 = list->blocks; gn2 != (gnode_t *)0x0; gn2 = gn2->next) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/listelem_alloc.c"
            ,0x125,"%p (%d * %d bytes)\n",(gn2->data).ptr,*cpp,list->elemsize,local_30);
    cpp = (char **)cpp[1];
  }
  return;
}

Assistant:

void
listelem_stats(listelem_alloc_t *list)
{
    gnode_t *gn, *gn2;
    char **cpp;
    size_t n;

    E_INFO("Linklist stats:\n");
    for (n = 0, cpp = list->freelist; cpp;
         cpp = (char **) (*cpp), n++);
    E_INFO
        ("elemsize %lu, #alloc %lu, #freed %lu, #freelist %lu\n",
         (unsigned long)list->elemsize,
         (unsigned long)list->n_alloc,
         (unsigned long)list->n_freed,
         (unsigned long)n);
    E_INFO("Allocated blocks:\n");
    gn2 = list->blocksize;
    for (gn = list->blocks; gn; gn = gnode_next(gn)) {
	E_INFO("%p (%d * %d bytes)\n", gnode_ptr(gn), gnode_int32(gn2), list->elemsize);
        gn2 = gnode_next(gn2);
    }
}